

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSplitter.h
# Opt level: O2

void __thiscall Assimp::LineSplitter::get_tokens<10ul>(LineSplitter *this,char *(*tokens) [10])

{
  char *pcVar1;
  range_error *this_00;
  long lVar2;
  char *s;
  
  s = (this->mCur)._M_dataplus._M_p;
  SkipSpaces<char>(&s);
  lVar2 = 0;
  while( true ) {
    if (lVar2 == 10) {
      return;
    }
    if (((byte)*s < 0xe) && ((0x3401U >> ((byte)*s & 0x1f) & 1) != 0)) break;
    (*tokens)[lVar2] = s;
    pcVar1 = s;
    do {
      do {
        s = pcVar1;
        pcVar1 = s + 1;
      } while (0x20 < (ulong)(byte)*s);
    } while ((0x100000201U >> ((ulong)(byte)*s & 0x3f) & 1) == 0);
    SkipSpaces<char>(&s);
    lVar2 = lVar2 + 1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"Token count out of range, EOL reached");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

AI_FORCE_INLINE
void LineSplitter::get_tokens(const char* (&tokens)[N]) const {
    const char* s = operator->()->c_str();

    SkipSpaces(&s);
    for (size_t i = 0; i < N; ++i) {
        if (IsLineEnd(*s)) {
            throw std::range_error("Token count out of range, EOL reached");
        }
        tokens[i] = s;

        for (; *s && !IsSpace(*s); ++s);
        SkipSpaces(&s);
    }
}